

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O2

void embree::Device::setThreadErrorCode(RTCError error,string *msg)

{
  bool bVar1;
  RTCErrorMessage *pRVar2;
  
  pRVar2 = State::ErrorHandler::error((ErrorHandler *)State::g_errorHandler);
  if (pRVar2->error == RTC_ERROR_NONE) {
    pRVar2->error = error;
    bVar1 = std::operator!=(msg,"");
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&pRVar2->msg);
      return;
    }
  }
  return;
}

Assistant:

void Device::setThreadErrorCode(RTCError error, std::string const& msg)
  {
    RTCErrorMessage* stored_error = g_errorHandler.error();
    if (stored_error->error == RTC_ERROR_NONE) {
      stored_error->error = error;
      if (msg != "")
        stored_error->msg = msg;
    }
  }